

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

Vec_Int_t *
Gia_GenCreateMuxes(Gia_Man_t *p,Gia_Man_t *pNew,Vec_Int_t *vFlops,int nLutNum,int nLutSize,
                  Vec_Int_t *vParLits,int fUseRi)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  uint local_88 [2];
  int pCtrl [16];
  int iFlop;
  int iMux;
  int k;
  int i;
  Vec_Int_t *vLits;
  Vec_Int_t *vParLits_local;
  int nLutSize_local;
  int nLutNum_local;
  Vec_Int_t *vFlops_local;
  Gia_Man_t *pNew_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(nLutNum);
  iVar1 = Vec_IntSize(vFlops);
  if (iVar1 != nLutNum * nLutSize) {
    __assert_fail("Vec_IntSize(vFlops) == nLutNum * nLutSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaQbf.c"
                  ,0x76,
                  "Vec_Int_t *Gia_GenCreateMuxes(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int, Vec_Int_t *, int)"
                 );
  }
  iMux = 0;
  do {
    if (nLutNum <= iMux) {
      return p_00;
    }
    for (iFlop = 0; iFlop < nLutSize; iFlop = iFlop + 1) {
      iVar1 = Vec_IntEntry(vFlops,iMux * nLutSize + iFlop);
      pCtrl[0xe] = iVar1;
      if (iVar1 < 0) {
LAB_009a4ea8:
        __assert_fail("iFlop >= 0 && iFlop < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaQbf.c"
                      ,0x7c,
                      "Vec_Int_t *Gia_GenCreateMuxes(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int, Vec_Int_t *, int)"
                     );
      }
      iVar2 = Gia_ManRegNum(p);
      if (iVar2 <= iVar1) goto LAB_009a4ea8;
      if (fUseRi == 0) {
        pGVar3 = Gia_ManRo(p,pCtrl[0xe]);
        pCtrl[(long)iFlop + -2] = pGVar3->Value;
      }
      else {
        pGVar3 = Gia_ManRi(p,pCtrl[0xe]);
        pCtrl[(long)iFlop + -2] = pGVar3->Value;
      }
    }
    pCtrl[0xf] = Gia_GenCreateMux_rec
                           (pNew,(int *)local_88,nLutSize,vParLits,
                            iMux * (1 << ((byte)nLutSize & 0x1f)));
    Vec_IntPush(p_00,pCtrl[0xf]);
    iMux = iMux + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_GenCreateMuxes( Gia_Man_t * p, Gia_Man_t * pNew, Vec_Int_t * vFlops, int nLutNum, int nLutSize, Vec_Int_t * vParLits, int fUseRi )
{
    Vec_Int_t * vLits = Vec_IntAlloc( nLutNum );
    int i, k, iMux, iFlop, pCtrl[16];
    // add MUXes for each group of flops
    assert( Vec_IntSize(vFlops) == nLutNum * nLutSize );
    for ( i = 0; i < nLutNum; i++ )
    {
        for ( k = 0; k < nLutSize; k++ )
        {
            iFlop = Vec_IntEntry(vFlops, i * nLutSize + k);
            assert( iFlop >= 0 && iFlop < Gia_ManRegNum(p) );
            if ( fUseRi )
                pCtrl[k] = Gia_ManRi(p, iFlop)->Value;
            else
                pCtrl[k] = Gia_ManRo(p, iFlop)->Value;
        }
        iMux = Gia_GenCreateMux_rec( pNew, pCtrl, nLutSize, vParLits, i * (1 << nLutSize) );
        Vec_IntPush( vLits, iMux );
    }
    return vLits;
}